

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

bool __thiscall xray_re::xr_memory_writer::save_to(xr_memory_writer *this,char *path,string *name)

{
  xr_writer *pxVar1;
  reference pvVar2;
  size_type sVar3;
  xr_writer *local_38;
  xr_writer *w;
  xr_file_system *fs;
  string *name_local;
  char *path_local;
  xr_memory_writer *this_local;
  
  fs = (xr_file_system *)name;
  name_local = (string *)path;
  path_local = (char *)this;
  w = (xr_writer *)xr_file_system::instance();
  pxVar1 = xr_file_system::w_open((xr_file_system *)w,(char *)name_local,(string *)fs);
  if (pxVar1 != (xr_writer *)0x0) {
    local_38 = pxVar1;
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_buffer,0);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
    (*pxVar1->_vptr_xr_writer[2])(pxVar1,pvVar2,sVar3);
    xr_file_system::w_close((xr_file_system *)w,&local_38);
  }
  return pxVar1 != (xr_writer *)0x0;
}

Assistant:

bool xr_memory_writer::save_to(const char* path, const std::string& name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_writer* w = fs.w_open(path, name);
	if (w == 0)
		return false;
	w->w_raw(&m_buffer[0], m_buffer.size());
	fs.w_close(w);
	return true;
}